

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::SourceCodeInfo_Location::ByteSize(SourceCodeInfo_Location *this)

{
  uint value;
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint value_00;
  uint uVar5;
  long lVar6;
  
  value_00 = 0;
  iVar3 = 0;
  if ((this->_has_bits_[0] & 0x3fc) != 0) {
    iVar3 = 0;
    if ((this->_has_bits_[0] & 4) != 0) {
      psVar1 = this->leading_comments_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar3 = 2;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        iVar3 = iVar3 + 1;
      }
      iVar3 = iVar3 + (int)psVar1->_M_string_length;
    }
    if ((this->_has_bits_[0] & 8) != 0) {
      psVar1 = this->trailing_comments_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar5) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar3 = iVar3 + iVar4 + (int)psVar1->_M_string_length + 1;
    }
  }
  if (0 < (this->path_).current_size_) {
    lVar6 = 0;
    value_00 = 0;
    do {
      uVar5 = (this->path_).elements_[lVar6];
      if ((int)uVar5 < 0) {
        iVar4 = 10;
      }
      else {
        iVar4 = 1;
        if (0x7f < uVar5) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        }
      }
      value_00 = value_00 + iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->path_).current_size_);
  }
  if (0 < (int)value_00) {
    iVar4 = 2;
    if (0x7f < value_00) {
      iVar4 = io::CodedOutputStream::VarintSize32Fallback(value_00);
      iVar4 = iVar4 + 1;
    }
    iVar3 = iVar4 + iVar3;
  }
  this->_path_cached_byte_size_ = value_00;
  if ((this->span_).current_size_ < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      value = (this->span_).elements_[lVar6];
      if ((int)value < 0) {
        iVar4 = 10;
      }
      else {
        iVar4 = 1;
        if (0x7f < value) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(value);
        }
      }
      uVar5 = uVar5 + iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->span_).current_size_);
  }
  iVar3 = iVar3 + value_00;
  if (0 < (int)uVar5) {
    iVar4 = 2;
    if (0x7f < uVar5) {
      iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      iVar4 = iVar4 + 1;
    }
    iVar3 = iVar4 + iVar3;
  }
  this->_span_cached_byte_size_ = uVar5;
  iVar3 = iVar3 + uVar5;
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar4 + iVar3;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int SourceCodeInfo_Location::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    // optional string leading_comments = 3;
    if (has_leading_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->leading_comments());
    }

    // optional string trailing_comments = 4;
    if (has_trailing_comments()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->trailing_comments());
    }

  }
  // repeated int32 path = 1 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->path_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->path(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    int data_size = 0;
    for (int i = 0; i < this->span_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->span(i));
    }
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _span_cached_byte_size_ = data_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}